

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O3

string * __thiscall
t_py_generator::render_const_value_abi_cxx11_
          (string *__return_storage_ptr__,t_py_generator *this,t_type *type,t_const_value *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  _func_int *p_Var3;
  long lVar4;
  long lVar5;
  size_t __n;
  _Alloc_hider _Var6;
  t_py_generator *ptVar7;
  string *psVar8;
  int iVar9;
  t_const_value_type tVar10;
  t_type *ttype;
  ostream *poVar11;
  t_type *ptVar12;
  int64_t iVar13;
  _Base_ptr p_Var14;
  ostringstream *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  undefined4 extraout_var;
  long *plVar16;
  undefined4 extraout_var_00;
  _Rb_tree_header *p_Var17;
  size_type *psVar18;
  ulong uVar19;
  t_type *type_00;
  char *pcVar20;
  _func_int **pp_Var21;
  pointer pptVar22;
  bool bVar23;
  undefined1 auVar24 [12];
  ostringstream out;
  string local_220;
  t_py_generator *local_200;
  t_type *local_1f8;
  string local_1f0;
  string *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [376];
  
  ttype = t_type::get_true_type(type);
  this_00 = (ostringstream *)local_1a8;
  std::__cxx11::ostringstream::ostringstream(this_00);
  iVar9 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
  if ((char)iVar9 == '\0') {
    iVar9 = (*(ttype->super_t_doc)._vptr_t_doc[10])();
    if ((char)iVar9 == '\0') {
      iVar9 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])();
      local_200 = this;
      if (((char)iVar9 == '\0') &&
         (iVar9 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(), (char)iVar9 == '\0')) {
        iVar9 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
        if ((char)iVar9 == '\0') {
          iVar9 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
          if (((char)iVar9 == '\0') &&
             (iVar9 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(), (char)iVar9 == '\0')) {
            pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __cxa_allocate_exception(0x20);
            iVar9 = (*(ttype->super_t_doc)._vptr_t_doc[3])();
            std::operator+(pbVar15,"CANNOT GENERATE CONSTANT FOR TYPE: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var_00,iVar9));
            __cxa_throw(pbVar15,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          local_1d0 = __return_storage_ptr__;
          (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
          local_1f8 = *(t_type **)&ttype[1].super_t_doc.has_doc_;
          iVar9 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
          if ((char)iVar9 != '\0') {
            bVar23 = is_immutable(ttype);
            if (bVar23) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"frozen",6);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"set(",4);
          }
          bVar23 = is_immutable(ttype);
          if (bVar23) {
            pcVar20 = "(";
          }
          else {
            iVar9 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
            pcVar20 = "[";
            if ((char)iVar9 != '\0') {
              pcVar20 = "(";
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar20,1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                     ::endl_abi_cxx11_._M_string_length);
          ptVar7 = local_200;
          iVar9 = (this->super_t_generator).indent_;
          (this->super_t_generator).indent_ = iVar9 + 1;
          pptVar22 = (value->listVal_).
                     super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          if (pptVar22 !=
              (value->listVal_).
              super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            do {
              poVar11 = t_generator::indent(&ptVar7->super_t_generator,(ostream *)local_1a8);
              render_const_value_abi_cxx11_(&local_220,ptVar7,local_1f8,*pptVar22);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,local_220._M_dataplus._M_p,local_220._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,",",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._M_dataplus._M_p != &local_220.field_2) {
                operator_delete(local_220._M_dataplus._M_p);
              }
              pptVar22 = pptVar22 + 1;
            } while (pptVar22 !=
                     (value->listVal_).
                     super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                     super__Vector_impl_data._M_finish);
            iVar9 = (local_200->super_t_generator).indent_ + -1;
            this = local_200;
          }
          (this->super_t_generator).indent_ = iVar9;
          bVar23 = is_immutable(ttype);
          __return_storage_ptr__ = local_1d0;
          if ((bVar23) || (iVar9 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(), (char)iVar9 != '\0'))
          {
            poVar11 = t_generator::indent(&this->super_t_generator,(ostream *)local_1a8);
            pcVar20 = "Throws -> tok_throws ( FieldList )";
          }
          else {
            poVar11 = t_generator::indent(&this->super_t_generator,(ostream *)local_1a8);
            pcVar20 = "ConstList => [ ConstListContents ]";
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar20 + 0x21,1);
          iVar9 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
          if ((char)iVar9 != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
          }
        }
        else {
          local_1f8 = *(t_type **)&ttype[1].super_t_doc.has_doc_;
          ptVar12 = *(t_type **)&ttype[1].annotations_._M_t._M_impl;
          bVar23 = is_immutable(ttype);
          if (bVar23) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"TFrozenDict(",0xc);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                     ::endl_abi_cxx11_._M_string_length);
          ptVar7 = local_200;
          iVar9 = (this->super_t_generator).indent_;
          (this->super_t_generator).indent_ = iVar9 + 1;
          p_Var14 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var17 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)p_Var14 != p_Var17) {
            do {
              poVar11 = t_generator::indent(&ptVar7->super_t_generator,(ostream *)local_1a8);
              render_const_value_abi_cxx11_
                        (&local_220,ptVar7,local_1f8,*(t_const_value **)(p_Var14 + 1));
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,local_220._M_dataplus._M_p,local_220._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,": ",2);
              render_const_value_abi_cxx11_
                        (&local_1f0,local_200,ptVar12,(t_const_value *)p_Var14[1]._M_parent);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                                            local_1f0._M_dataplus._M_p._0_1_),
                                   local_1f0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,",",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
                  &local_1f0.field_2) {
                operator_delete((undefined1 *)
                                CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                         local_1f0._M_dataplus._M_p._0_1_));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._M_dataplus._M_p != &local_220.field_2) {
                operator_delete(local_220._M_dataplus._M_p);
              }
              p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
            } while ((_Rb_tree_header *)p_Var14 != p_Var17);
            iVar9 = (local_200->super_t_generator).indent_ + -1;
            this = local_200;
          }
          (this->super_t_generator).indent_ = iVar9;
          poVar11 = t_generator::indent(&this->super_t_generator,(ostream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"}",1);
          bVar23 = is_immutable(ttype);
          if (bVar23) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
          }
        }
      }
      else {
        type_name_abi_cxx11_(&local_220,this,ttype);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,local_220._M_dataplus._M_p,
                             local_220._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"(**{",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        paVar1 = &local_220.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != paVar1) {
          operator_delete(local_220._M_dataplus._M_p);
        }
        iVar9 = (this->super_t_generator).indent_;
        (this->super_t_generator).indent_ = iVar9 + 1;
        ptVar12 = (t_type *)(value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_1f8 = (t_type *)&(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
        psVar8 = __return_storage_ptr__;
        if (ptVar12 != local_1f8) {
          do {
            local_1d0 = psVar8;
            pp_Var21 = ttype[1].super_t_doc._vptr_t_doc;
            if (pp_Var21 == (_func_int **)ttype[1].super_t_doc.doc_._M_dataplus._M_p) {
LAB_0030f3f0:
              pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __cxa_allocate_exception(0x20);
              iVar9 = (*(ttype->super_t_doc)._vptr_t_doc[3])();
              std::operator+(&local_1f0,"type error: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(extraout_var,iVar9));
              plVar16 = (long *)std::__cxx11::string::append((char *)&local_1f0);
              local_220._M_dataplus._M_p = (pointer)*plVar16;
              psVar18 = (size_type *)(plVar16 + 2);
              if ((size_type *)local_220._M_dataplus._M_p == psVar18) {
                local_220.field_2._M_allocated_capacity = *psVar18;
                local_220.field_2._8_4_ = (undefined4)plVar16[3];
                local_220.field_2._12_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
                local_220._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_220.field_2._M_allocated_capacity = *psVar18;
              }
              local_220._M_string_length = plVar16[1];
              *plVar16 = (long)psVar18;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              lVar4 = *(long *)((long)&(ptVar12->super_t_doc).doc_.field_2 + 8);
              local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
              lVar5 = *(long *)(lVar4 + 0x48);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1c8,lVar5,*(long *)(lVar4 + 0x50) + lVar5);
              std::operator+(pbVar15,&local_220,&local_1c8);
              __cxa_throw(pbVar15,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            type_00 = (t_type *)0x0;
            do {
              p_Var3 = *pp_Var21;
              lVar4 = *(long *)((long)&(ptVar12->super_t_doc).doc_.field_2 + 8);
              lVar5 = *(long *)(lVar4 + 0x48);
              local_220._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_220,lVar5,*(long *)(lVar4 + 0x50) + lVar5);
              _Var6._M_p = local_220._M_dataplus._M_p;
              __n = *(size_t *)(p_Var3 + 0x70);
              if (__n == local_220._M_string_length) {
                if (__n == 0) {
                  bVar23 = true;
                }
                else {
                  iVar9 = bcmp(*(void **)(p_Var3 + 0x68),local_220._M_dataplus._M_p,__n);
                  bVar23 = iVar9 == 0;
                }
              }
              else {
                bVar23 = false;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p != paVar1) {
                operator_delete(_Var6._M_p);
              }
              this = local_200;
              if (bVar23) {
                type_00 = *(t_type **)(*pp_Var21 + 0x60);
              }
              pp_Var21 = pp_Var21 + 1;
            } while (pp_Var21 != (_func_int **)ttype[1].super_t_doc.doc_._M_dataplus._M_p);
            if (type_00 == (t_type *)0x0) goto LAB_0030f3f0;
            poVar11 = t_generator::indent(&local_200->super_t_generator,(ostream *)local_1a8);
            render_const_value_abi_cxx11_
                      (&local_220,this,g_type_string,
                       *(t_const_value **)((long)&(ptVar12->super_t_doc).doc_.field_2 + 8));
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,local_220._M_dataplus._M_p,local_220._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,": ",2);
            render_const_value_abi_cxx11_
                      (&local_1f0,this,type_00,*(t_const_value **)&(ptVar12->super_t_doc).has_doc_);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                                          local_1f0._M_dataplus._M_p._0_1_),
                                 local_1f0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,",",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
                &local_1f0.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                       local_1f0._M_dataplus._M_p._0_1_));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != paVar1) {
              operator_delete(local_220._M_dataplus._M_p);
            }
            ptVar12 = (t_type *)std::_Rb_tree_increment((_Rb_tree_node_base *)ptVar12);
            psVar8 = local_1d0;
          } while (ptVar12 != local_1f8);
          iVar9 = (this->super_t_generator).indent_ + -1;
          __return_storage_ptr__ = local_1d0;
        }
        (this->super_t_generator).indent_ = iVar9;
        poVar11 = t_generator::indent(&this->super_t_generator,(ostream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"})",2);
      }
    }
    else {
      t_const_value::get_integer(value);
      std::ostream::_M_insert<long>((long)local_1a8);
    }
    goto LAB_0030f212;
  }
  uVar2 = *(uint *)&ttype[1].super_t_doc._vptr_t_doc;
  switch(uVar2) {
  case 1:
    iVar9 = (*(ttype->super_t_doc)._vptr_t_doc[7])();
    if ((char)iVar9 != '\0') {
      local_220._M_dataplus._M_p._0_1_ = 0x62;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_220,1);
    }
    local_220._M_dataplus._M_p._0_1_ = 0x22;
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)&local_220,1);
    t_generator::get_escaped_string_abi_cxx11_(&local_220,&this->super_t_generator,value);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,local_220._M_dataplus._M_p,local_220._M_string_length);
    local_1f0._M_dataplus._M_p._0_1_ = 0x22;
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_1f0,1);
    break;
  case 2:
    iVar13 = t_const_value::get_integer(value);
    pcVar20 = "framed = False";
    if (0 < iVar13) {
      pcVar20 = "framed = True";
    }
    pcVar20 = pcVar20 + 9;
    uVar19 = (ulong)(0 < iVar13) ^ 5;
LAB_0030f20a:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar20,uVar19);
    goto LAB_0030f212;
  case 3:
  case 4:
  case 5:
  case 6:
    t_const_value::get_integer(value);
    std::ostream::_M_insert<long>((long)local_1a8);
    goto LAB_0030f212;
  case 7:
    tVar10 = t_const_value::get_type(value);
    if (tVar10 == CV_INTEGER) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"float(",6);
      t_const_value::get_integer(value);
      this_00 = (ostringstream *)std::ostream::_M_insert<long>((long)local_1a8);
      uVar19 = 1;
      pcVar20 = ")";
      goto LAB_0030f20a;
    }
    t_generator::emit_double_as_string_abi_cxx11_
              (&local_220,&this->super_t_generator,value->doubleVal_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
    break;
  default:
    auVar24 = __cxa_allocate_exception(0x20);
    t_base_type::t_base_name_abi_cxx11_(&local_220,(t_base_type *)(ulong)uVar2,auVar24._8_4_);
    std::operator+(auVar24._0_8_,"compiler error: no const of base type ",&local_220);
    __cxa_throw(auVar24._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
LAB_0030f212:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

string t_py_generator::render_const_value(t_type* type, t_const_value* value) {
  type = get_true_type(type);
  std::ostringstream out;

  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_STRING:
      if (((t_base_type*)type)->is_binary()) {
        out << 'b';
      }
      out << '"' << get_escaped_string(value) << '"';
      break;
    case t_base_type::TYPE_BOOL:
      out << (value->get_integer() > 0 ? "True" : "False");
      break;
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
    case t_base_type::TYPE_I64:
      out << value->get_integer();
      break;
    case t_base_type::TYPE_DOUBLE:
      if (value->get_type() == t_const_value::CV_INTEGER) {
        out << "float(" << value->get_integer() << ")";
      } else {
        out << emit_double_as_string(value->get_double());
      }
      break;
    default:
      throw "compiler error: no const of base type " + t_base_type::t_base_name(tbase);
    }
  } else if (type->is_enum()) {
    out << value->get_integer();
  } else if (type->is_struct() || type->is_xception()) {
    out << type_name(type) << "(**{" << endl;
    indent_up();
    const vector<t_field*>& fields = ((t_struct*)type)->get_members();
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      t_type* field_type = nullptr;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + type->get_name() + " has no field " + v_iter->first->get_string();
      }
      indent(out) << render_const_value(g_type_string, v_iter->first) << ": "
          << render_const_value(field_type, v_iter->second) << "," << endl;
    }
    indent_down();
    indent(out) << "})";
  } else if (type->is_map()) {
    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();
    if (is_immutable(type)) {
      out << "TFrozenDict(";
    }
    out << "{" << endl;
    indent_up();
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      indent(out) << render_const_value(ktype, v_iter->first) << ": "
          << render_const_value(vtype, v_iter->second) << "," << endl;
    }
    indent_down();
    indent(out) << "}";
    if (is_immutable(type)) {
      out << ")";
    }
  } else if (type->is_list() || type->is_set()) {
    t_type* etype;
    if (type->is_list()) {
      etype = ((t_list*)type)->get_elem_type();
    } else {
      etype = ((t_set*)type)->get_elem_type();
    }
    if (type->is_set()) {
      if (is_immutable(type)) {
        out << "frozen";
      }
      out << "set(";
    }
    if (is_immutable(type) || type->is_set()) {
      out << "(" << endl;
    } else {
      out << "[" << endl;
    }
    indent_up();
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      indent(out) << render_const_value(etype, *v_iter) << "," << endl;
    }
    indent_down();
    if (is_immutable(type) || type->is_set()) {
      indent(out) << ")";
    } else {
      indent(out) << "]";
    }
    if (type->is_set()) {
      out << ")";
    }
  } else {
    throw "CANNOT GENERATE CONSTANT FOR TYPE: " + type->get_name();
  }

  return out.str();
}